

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values_unittest.cc
# Opt level: O0

void __thiscall
bssl::der::test::ParseValuesTest_ParseUint64_Test::ParseValuesTest_ParseUint64_Test
          (ParseValuesTest_ParseUint64_Test *this)

{
  ParseValuesTest_ParseUint64_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ParseValuesTest_ParseUint64_Test_00922390;
  return;
}

Assistant:

TEST(ParseValuesTest, ParseUint64) {
  for (size_t i = 0; i < std::size(kUint64TestData); i++) {
    const Uint64TestData &test_case = kUint64TestData[i];
    SCOPED_TRACE(i);

    uint64_t result;
    EXPECT_EQ(test_case.should_pass,
              ParseUint64(Input(test_case.input, test_case.length), &result));
    if (test_case.should_pass) {
      EXPECT_EQ(test_case.expected_value, result);
    }
  }
}